

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_convert.cpp
# Opt level: O0

void __thiscall tst_qpromise_convert::fulfillTAsU(tst_qpromise_convert *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QString local_270;
  QString local_258;
  QString local_240;
  Foo local_224;
  QPromise<(anonymous_namespace)::Foo> local_220;
  undefined1 local_210 [8];
  QPromise<QString> p_7;
  QString local_1e8;
  QString local_1d0;
  int local_1b4;
  QPromise<int> local_1b0;
  undefined1 local_1a0 [8];
  QPromise<QString> p_6;
  Bar local_188;
  Bar local_184;
  Bar local_180;
  Foo local_17c;
  QPromise<(anonymous_namespace)::Foo> local_178;
  undefined1 local_168 [8];
  QPromise<(anonymous_namespace)::Bar> p_5;
  QString local_140;
  QString local_128;
  QByteArray local_110;
  QPromise<QByteArray> local_f8;
  undefined1 local_e8 [8];
  QPromise<QString> p_4;
  Enum2 local_d0;
  Enum1 local_cc;
  QPromise<(anonymous_namespace)::Enum1> local_c8;
  undefined1 local_b8 [8];
  QPromise<(anonymous_namespace)::Enum2> p_3;
  Enum1 local_a0 [2];
  QPromise<int> local_98;
  undefined1 local_88 [8];
  QPromise<(anonymous_namespace)::Enum1> p_2;
  QPromise<(anonymous_namespace)::Enum1> local_70;
  undefined1 local_60 [8];
  QPromise<int> p_1;
  int local_48 [4];
  double local_38;
  QPromise<double> local_30;
  undefined1 local_20 [8];
  QPromise<int> p;
  tst_qpromise_convert *this_local;
  
  local_38 = 42.13;
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::resolve<double>((QtPromise *)&local_30,&local_38);
  QtPromise::QPromise<double>::convert<int>((QPromise<double> *)local_20);
  QtPromise::QPromise<double>::~QPromise(&local_30);
  local_48[0] = -1;
  iVar3 = waitForValue<int>((QPromise<int> *)local_20,local_48);
  bVar1 = QTest::qCompare(iVar3,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                          ,0x4f);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    bVar2 = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
    bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x50);
    if ((bVar1 & 1) == 0) {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
    }
    else {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
    }
  }
  else {
    p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
    p_2.super_QPromiseBase<(anonymous_namespace)::Enum1>.m_d.d._4_4_ = 1;
    QtPromise::resolve<(anonymous_namespace)::Enum1>
              ((QtPromise *)&local_70,
               (Enum1 *)((long)&p_2.super_QPromiseBase<(anonymous_namespace)::Enum1>.m_d.d + 4));
    QtPromise::QPromise<(anonymous_namespace)::Enum1>::convert<int>
              ((QPromise<(anonymous_namespace)::Enum1> *)local_60);
    QtPromise::QPromise<(anonymous_namespace)::Enum1>::~QPromise(&local_70);
    p_2.super_QPromiseBase<(anonymous_namespace)::Enum1>.m_d.d._0_4_ = 0xffffffff;
    iVar3 = waitForValue<int>((QPromise<int> *)local_60,
                              (int *)&p_2.super_QPromiseBase<(anonymous_namespace)::Enum1>.m_d);
    bVar1 = QTest::qCompare(iVar3,1,"waitForValue(p, -1)","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                            ,0x59);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      bVar2 = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_60);
      bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                             ,0x5a);
      if ((bVar1 & 1) == 0) {
        p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
      }
      else {
        p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
      }
    }
    else {
      p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
    }
    QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_60);
    if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
      local_a0[1] = 1;
      QtPromise::resolve<int>((QtPromise *)&local_98,(int *)(local_a0 + 1));
      QtPromise::QPromise<int>::convert<(anonymous_namespace)::Enum1>((QPromise<int> *)local_88);
      QtPromise::QPromise<int>::~QPromise(&local_98);
      p_3.super_QPromiseBase<(anonymous_namespace)::Enum2>.m_d.d._4_4_ = 0;
      local_a0[0] = waitForValue<(anonymous_namespace)::Enum1>
                              ((QPromise<(anonymous_namespace)::Enum1> *)local_88,
                               (Enum1 *)((long)&p_3.super_QPromiseBase<(anonymous_namespace)::Enum2>
                                                .m_d.d + 4));
      p_3.super_QPromiseBase<(anonymous_namespace)::Enum2>.m_d.d._0_4_ = 1;
      bVar2 = QTest::qCompare<(anonymous_namespace)::Enum1,(anonymous_namespace)::Enum1>
                        (local_a0,(Enum1 *)&p_3.super_QPromiseBase<(anonymous_namespace)::Enum2>.m_d
                         ,"waitForValue(p, Enum1::Value0)","Enum1::Value1",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                         ,99);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        bVar2 = QtPromise::QPromiseBase<(anonymous_namespace)::Enum1>::isFulfilled
                          ((QPromiseBase<(anonymous_namespace)::Enum1> *)local_88);
        bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                               ,100);
        if ((bVar1 & 1) == 0) {
          p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
        }
        else {
          p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
        }
      }
      else {
        p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
      }
      QtPromise::QPromise<(anonymous_namespace)::Enum1>::~QPromise
                ((QPromise<(anonymous_namespace)::Enum1> *)local_88);
      if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
        local_cc = Value1;
        QtPromise::resolve<(anonymous_namespace)::Enum1>((QtPromise *)&local_c8,&local_cc);
        QtPromise::QPromise<(anonymous_namespace)::Enum1>::convert<(anonymous_namespace)::Enum2>
                  ((QPromise<(anonymous_namespace)::Enum1> *)local_b8);
        QtPromise::QPromise<(anonymous_namespace)::Enum1>::~QPromise(&local_c8);
        p_4.super_QPromiseBase<QString>.m_d.d._4_4_ = 0;
        local_d0 = waitForValue<(anonymous_namespace)::Enum2>
                             ((QPromise<(anonymous_namespace)::Enum2> *)local_b8,
                              (Enum2 *)((long)&p_4.super_QPromiseBase<QString>.m_d.d + 4));
        p_4.super_QPromiseBase<QString>.m_d.d._0_4_ = 1;
        bVar2 = QTest::qCompare<(anonymous_namespace)::Enum2,(anonymous_namespace)::Enum2>
                          (&local_d0,(Enum2 *)&p_4.super_QPromiseBase<QString>.m_d,
                           "waitForValue(p, Enum2::Value0)","Enum2::Value1",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                           ,0x6d);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          bVar2 = QtPromise::QPromiseBase<(anonymous_namespace)::Enum2>::isFulfilled
                            ((QPromiseBase<(anonymous_namespace)::Enum2> *)local_b8);
          bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                 ,0x6e);
          if ((bVar1 & 1) == 0) {
            p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
          }
          else {
            p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
          }
        }
        else {
          p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
        }
        QtPromise::QPromise<(anonymous_namespace)::Enum2>::~QPromise
                  ((QPromise<(anonymous_namespace)::Enum2> *)local_b8);
        if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
          QByteArray::QByteArray(&local_110,"foo",-1);
          QtPromise::resolve<QByteArray>((QtPromise *)&local_f8,&local_110);
          QtPromise::QPromise<QByteArray>::convert<QString>((QPromise<QByteArray> *)local_e8);
          QtPromise::QPromise<QByteArray>::~QPromise(&local_f8);
          QByteArray::~QByteArray(&local_110);
          QString::QString(&local_140);
          waitForValue<QString>(&local_128,(QPromise<QString> *)local_e8,&local_140);
          QString::QString((QString *)&p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d,"foo")
          ;
          bVar2 = QTest::qCompare(&local_128,
                                  (QString *)&p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d
                                  ,"waitForValue(p, QString{})","QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                  ,0x78);
          QString::~QString((QString *)&p_5.super_QPromiseBase<(anonymous_namespace)::Bar>.m_d);
          QString::~QString(&local_128);
          QString::~QString(&local_140);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            bVar2 = QtPromise::QPromiseBase<QString>::isFulfilled((QPromiseBase<QString> *)local_e8)
            ;
            bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                   ,0x79);
            if ((bVar1 & 1) == 0) {
              p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
            }
            else {
              p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
            }
          }
          else {
            p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
          }
          QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_e8);
          if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
            anon_unknown.dwarf_36992::Foo::Foo(&local_17c,0x2a);
            QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_178,&local_17c);
            QtPromise::QPromise<(anonymous_namespace)::Foo>::convert<(anonymous_namespace)::Bar>
                      ((QPromise<(anonymous_namespace)::Foo> *)local_168);
            QtPromise::QPromise<(anonymous_namespace)::Foo>::~QPromise(&local_178);
            local_184.m_bar = 0;
            anon_unknown.dwarf_36992::Bar::Bar(&local_184);
            local_180 = waitForValue<(anonymous_namespace)::Bar>
                                  ((QPromise<(anonymous_namespace)::Bar> *)local_168,&local_184);
            anon_unknown.dwarf_36992::Foo::Foo
                      ((Foo *)((long)&p_6.super_QPromiseBase<QString>.m_d.d + 4),0x2a);
            anon_unknown.dwarf_36992::Bar::Bar
                      (&local_188,(Foo *)((long)&p_6.super_QPromiseBase<QString>.m_d.d + 4));
            bVar2 = QTest::qCompare<(anonymous_namespace)::Bar,(anonymous_namespace)::Bar>
                              (&local_180,&local_188,"waitForValue(p, Bar{})","Bar{42}",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                               ,0x83);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              bVar2 = QtPromise::QPromiseBase<(anonymous_namespace)::Bar>::isFulfilled
                                ((QPromiseBase<(anonymous_namespace)::Bar> *)local_168);
              bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                     ,0x84);
              if ((bVar1 & 1) == 0) {
                p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
              }
              else {
                p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
              }
            }
            else {
              p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
            }
            QtPromise::QPromise<(anonymous_namespace)::Bar>::~QPromise
                      ((QPromise<(anonymous_namespace)::Bar> *)local_168);
            if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
              local_1b4 = 0x2a;
              QtPromise::resolve<int>((QtPromise *)&local_1b0,&local_1b4);
              QtPromise::QPromise<int>::convert<QString>((QPromise<int> *)local_1a0);
              QtPromise::QPromise<int>::~QPromise(&local_1b0);
              QString::QString(&local_1e8);
              waitForValue<QString>(&local_1d0,(QPromise<QString> *)local_1a0,&local_1e8);
              QString::QString((QString *)&p_7.super_QPromiseBase<QString>.m_d,"42");
              bVar2 = QTest::qCompare(&local_1d0,(QString *)&p_7.super_QPromiseBase<QString>.m_d,
                                      "waitForValue(p, QString{})","QString{\"42\"}",
                                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                      ,0x8d);
              QString::~QString((QString *)&p_7.super_QPromiseBase<QString>.m_d);
              QString::~QString(&local_1d0);
              QString::~QString(&local_1e8);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                bVar2 = QtPromise::QPromiseBase<QString>::isFulfilled
                                  ((QPromiseBase<QString> *)local_1a0);
                bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                       ,0x8e);
                if ((bVar1 & 1) == 0) {
                  p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
                }
                else {
                  p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
                }
              }
              else {
                p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
              }
              QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_1a0);
              if (p_1.super_QPromiseBase<int>.m_d.d._4_4_ == 0) {
                anon_unknown.dwarf_36992::Foo::Foo(&local_224,0x2a);
                QtPromise::resolve<(anonymous_namespace)::Foo>((QtPromise *)&local_220,&local_224);
                QtPromise::QPromise<(anonymous_namespace)::Foo>::convert<QString>
                          ((QPromise<(anonymous_namespace)::Foo> *)local_210);
                QtPromise::QPromise<(anonymous_namespace)::Foo>::~QPromise(&local_220);
                QString::QString(&local_258);
                waitForValue<QString>(&local_240,(QPromise<QString> *)local_210,&local_258);
                QString::QString(&local_270,"Foo{42}");
                bVar2 = QTest::qCompare(&local_240,&local_270,"waitForValue(p, QString{})",
                                        "QString{\"Foo{42}\"}",
                                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                        ,0x98);
                QString::~QString(&local_270);
                QString::~QString(&local_240);
                QString::~QString(&local_258);
                if (((bVar2 ^ 0xffU) & 1) == 0) {
                  bVar2 = QtPromise::QPromiseBase<QString>::isFulfilled
                                    ((QPromiseBase<QString> *)local_210);
                  bVar1 = QTest::qVerify(bVar2,"p.isFulfilled()","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_convert.cpp"
                                         ,0x99);
                  if ((bVar1 & 1) == 0) {
                    p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
                  }
                  else {
                    p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 0;
                  }
                }
                else {
                  p_1.super_QPromiseBase<int>.m_d.d._4_4_ = 1;
                }
                QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_210);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void tst_qpromise_convert::fulfillTAsU()
{
    // Static cast between primitive types.
    {
        auto p = QtPromise::resolve(42.13).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 42);
        QVERIFY(p.isFulfilled());
    }

    // Convert enum class to int.
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<int>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));

        QCOMPARE(waitForValue(p, -1), 1);
        QVERIFY(p.isFulfilled());
    }

    // Convert int to enum class.
    {
        auto p = QtPromise::resolve(1).convert<Enum1>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum1>>::value));

        QCOMPARE(waitForValue(p, Enum1::Value0), Enum1::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Convert between enums
    {
        auto p = QtPromise::resolve(Enum1::Value1).convert<Enum2>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Enum2>>::value));

        QCOMPARE(waitForValue(p, Enum2::Value0), Enum2::Value1);
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(QByteArray{"foo"}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"foo"});
        QVERIFY(p.isFulfilled());
    }

    // Converting constructor for non-Qt types.
    // https://en.cppreference.com/w/cpp/language/converting_constructor
    {
        auto p = QtPromise::resolve(Foo{42}).convert<Bar>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<Bar>>::value));

        QCOMPARE(waitForValue(p, Bar{}), Bar{42});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of types Qt is aware of via QVariant.
    {
        auto p = QtPromise::resolve(42).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"42"});
        QVERIFY(p.isFulfilled());
    }

    // Conversion of a non-Qt type via QVariant.
    // https://doc.qt.io/qt-5/qmetatype.html#registerConverter
    {
        auto p = QtPromise::resolve(Foo{42}).convert<QString>();

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QString>>::value));

        QCOMPARE(waitForValue(p, QString{}), QString{"Foo{42}"});
        QVERIFY(p.isFulfilled());
    }
}